

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O1

wchar_t cmp_desc_prio(void *left,void *right)

{
  wchar_t wVar1;
  wchar_t wVar2;
  ui_entry *entry;
  ui_entry *entry_00;
  char *name;
  wchar_t wVar3;
  undefined8 in_RAX;
  uint uVar4;
  wchar_t ind;
  uint local_34;
  
  name = category_for_cmp_desc_prio;
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  entry = *left;
  entry_00 = *right;
  if (category_for_cmp_desc_prio == (char *)0x0) {
    uVar4 = 0xffffffff;
    local_34 = 0xffffffff;
  }
  else {
    wVar3 = ui_entry_search_categories(entry,category_for_cmp_desc_prio,(int *)&local_34);
    uVar4 = -(uint)(wVar3 == L'\0') | local_34;
    wVar3 = ui_entry_search_categories(entry_00,name,(int *)&local_34);
    local_34 = -(uint)(wVar3 == L'\0') | local_34;
  }
  if ((int)uVar4 < 0) {
    wVar3 = L'\x01';
    if ((int)local_34 < 0) {
LAB_001e279f:
      wVar3 = strcmp(entry->name,entry_00->name);
      return wVar3;
    }
  }
  else {
    wVar3 = L'\xffffffff';
    if (-1 < (int)local_34) {
      wVar1 = entry_00->categories[local_34].priority;
      wVar2 = entry->categories[uVar4].priority;
      if ((wVar2 <= wVar1) && (wVar3 = L'\x01', wVar1 <= wVar2)) goto LAB_001e279f;
    }
  }
  return wVar3;
}

Assistant:

static int cmp_desc_prio(const void *left, const void *right)
{
	const struct ui_entry *eleft =
		*((const struct ui_entry* const *) left);
	const struct ui_entry *eright =
		*((const struct ui_entry* const *) right);
	int left_ind = -1, right_ind = -1;
	int result;

	if (category_for_cmp_desc_prio) {
		int ind;

		if (ui_entry_search_categories(eleft,
			category_for_cmp_desc_prio, &ind)) {
			left_ind = ind;
		}
		if (ui_entry_search_categories(eright,
			category_for_cmp_desc_prio, &ind)) {
			right_ind = ind;
		}
	}
	if (left_ind >= 0) {
		if (right_ind >= 0) {
			if (eleft->categories[left_ind].priority >
				eright->categories[right_ind].priority) {
				result = -1;
			} else if (eleft->categories[left_ind].priority <
				   eright->categories[right_ind].priority) {
				result = 1;
			} else {
				result = strcmp(eleft->name, eright->name);
			}
		} else {
			/*
			 * right is not in the sort category so it should be
			 * pushed toward the end.
			 */
			result = -1;
		}
	} else if (right_ind >= 0) {
		/*
		 * left is not in the sort category so it should be pushed
		 * towards the end.
		 */
		result = 1;
	} else {
		result = strcmp(eleft->name, eright->name);
	}
	return result;
}